

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.hpp
# Opt level: O3

void __thiscall
glu::SubTypeIterator<glu::IsVectorOrScalarType>::findNext
          (SubTypeIterator<glu::IsVectorOrScalarType> *this)

{
  int *piVar1;
  TypeComponentVector *this_00;
  __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  begin;
  VarType *type;
  __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  in_R8;
  VarType curType;
  VarTypeComponent local_50;
  VarType local_48;
  
  type = (VarType *)
         (this->m_path).
         super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
         super__Vector_impl_data._M_start;
  begin._M_current =
       (this->m_path).
       super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (type != (VarType *)begin._M_current) {
    piVar1 = (int *)((long)&((VarType *)((long)begin._M_current + -0x18))->m_data + 0xc);
    *piVar1 = *piVar1 + 1;
  }
  this_00 = &this->m_path;
  do {
    getVarType<__gnu_cxx::__normal_iterator<glu::VarTypeComponent_const*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
              (&local_48,(glu *)this->m_type,type,begin,in_R8);
    if (local_48.m_type == TYPE_STRUCT) {
      local_50.type = STRUCT_MEMBER;
      local_50.index = 0;
      std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
      emplace_back<glu::VarTypeComponent>(this_00,&local_50);
    }
    else if (local_48.m_type == TYPE_ARRAY) {
      local_50.type = ARRAY_ELEMENT;
      local_50.index = 0;
      std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
      emplace_back<glu::VarTypeComponent>(this_00,&local_50);
    }
    else if (local_48.m_type == TYPE_BASIC) {
      if ((((ulong)local_48.m_data.basic.type < 0x23) &&
          ((0x7f803c01eU >> ((ulong)local_48.m_data.basic.type & 0x3f) & 1) != 0)) ||
         (local_48.m_data.basic.type - TYPE_BOOL < 4)) {
        VarType::~VarType(&local_48);
        return;
      }
      if (local_48.m_data.basic.type - TYPE_FLOAT_MAT2 < 9 ||
          local_48.m_data.basic.type - TYPE_DOUBLE_MAT2 < 9) {
        local_50.type = MATRIX_COLUMN;
        local_50.index = 0;
        std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
        emplace_back<glu::VarTypeComponent>(this_00,&local_50);
      }
      else if ((local_48.m_data.basic.type < TYPE_DOUBLE_MAT2) &&
              ((0x3801cU >> (local_48.m_data.basic.type & TYPE_UINT) & 1) != 0)) {
        local_50.type = VECTOR_COMPONENT;
        local_50.index = 0;
        std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
        emplace_back<glu::VarTypeComponent>(this_00,&local_50);
      }
    }
    VarType::~VarType(&local_48);
    type = (VarType *)
           (this->m_path).
           super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl
           .super__Vector_impl_data._M_start;
    begin._M_current =
         (this->m_path).
         super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
         super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

void SubTypeIterator<IsExpanded>::findNext (void)
{
	if (!m_path.empty())
	{
		// Increment child counter in current level.
		VarTypeComponent& curComp = m_path.back();
		curComp.index += 1;
	}

	for (;;)
	{
		VarType curType = getVarType(*m_type, m_path);

		if (IsExpanded()(curType))
			break;

		// Recurse into child type.
		if (curType.isBasicType())
		{
			DataType basicType = curType.getBasicType();

			if (isDataTypeMatrix(basicType))
				m_path.push_back(VarTypeComponent(VarTypeComponent::MATRIX_COLUMN, 0));
			else if (isDataTypeVector(basicType))
				m_path.push_back(VarTypeComponent(VarTypeComponent::VECTOR_COMPONENT, 0));
			else
				DE_ASSERT(false); // Can't expand scalars - IsExpanded() is buggy.
		}
		else if (curType.isArrayType())
			m_path.push_back(VarTypeComponent(VarTypeComponent::ARRAY_ELEMENT, 0));
		else if (curType.isStructType())
			m_path.push_back(VarTypeComponent(VarTypeComponent::STRUCT_MEMBER, 0));
		else
			DE_ASSERT(false);
	}
}